

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O0

void cuddHashTableQuit(DdHashTable *hash)

{
  uint uVar1;
  DdManager *table;
  DdHashItem *pDVar2;
  uint numBuckets;
  DdHashItem **nextmem;
  DdHashItem **memlist;
  DdHashItem *bucket;
  DdManager *dd;
  uint i;
  DdHashTable *hash_local;
  
  table = hash->manager;
  uVar1 = hash->numBuckets;
  for (dd._4_4_ = 0; dd._4_4_ < uVar1; dd._4_4_ = dd._4_4_ + 1) {
    for (memlist = &hash->bucket[dd._4_4_]->next; memlist != (DdHashItem **)0x0;
        memlist = &(*memlist)->next) {
      Cudd_RecursiveDeref(table,(DdNode *)memlist[2]);
    }
  }
  pDVar2 = (DdHashItem *)hash->memoryList;
  while (nextmem = &pDVar2->next, nextmem != (DdHashItem **)0x0) {
    pDVar2 = *nextmem;
    if (nextmem != (DdHashItem **)0x0) {
      free(nextmem);
    }
  }
  if (hash->bucket != (DdHashItem **)0x0) {
    free(hash->bucket);
    hash->bucket = (DdHashItem **)0x0;
  }
  if (hash != (DdHashTable *)0x0) {
    free(hash);
  }
  return;
}

Assistant:

void
cuddHashTableQuit(
  DdHashTable * hash)
{
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    unsigned int i;
    DdManager *dd = hash->manager;
    DdHashItem *bucket;
    DdHashItem **memlist, **nextmem;
    unsigned int numBuckets = hash->numBuckets;

    for (i = 0; i < numBuckets; i++) {
        bucket = hash->bucket[i];
        while (bucket != NULL) {
            Cudd_RecursiveDeref(dd, bucket->value);
            bucket = bucket->next;
        }
    }

    memlist = hash->memoryList;
    while (memlist != NULL) {
        nextmem = (DdHashItem **) memlist[0];
        ABC_FREE(memlist);
        memlist = nextmem;
    }

    ABC_FREE(hash->bucket);
    ABC_FREE(hash);
#ifdef __osf__
#pragma pointer_size restore
#endif

    return;

}